

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

void __thiscall re2::SparseArray<int>::SparseArray(SparseArray<int> *this,SparseArray<int> *src)

{
  int iVar1;
  IndexValue *__result;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  SparseArray<int> *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  IndexValue *__first;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  *in_RDI = *in_RSI;
  __first = (IndexValue *)(in_RDI + 2);
  max_size(in_stack_ffffffffffffff98);
  PODArray<int>::PODArray
            ((PODArray<int> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),iVar1);
  max_size(in_stack_ffffffffffffff98);
  PODArray<re2::SparseArray<int>::IndexValue>::PODArray
            ((PODArray<re2::SparseArray<int>::IndexValue> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),iVar1);
  __result = (IndexValue *)PODArray<int>::data((PODArray<int> *)0x260cdc);
  iVar1 = max_size(in_stack_ffffffffffffff98);
  PODArray<int>::data((PODArray<int> *)0x260cff);
  std::copy_n<int*,int,int*>(&__first->index_,iVar1,&__result->index_);
  PODArray<re2::SparseArray<int>::IndexValue>::data
            ((PODArray<re2::SparseArray<int>::IndexValue> *)0x260d20);
  max_size(in_stack_ffffffffffffff98);
  PODArray<re2::SparseArray<int>::IndexValue>::data
            ((PODArray<re2::SparseArray<int>::IndexValue> *)0x260d45);
  std::copy_n<re2::SparseArray<int>::IndexValue*,int,re2::SparseArray<int>::IndexValue*>
            (__first,iVar1,__result);
  return;
}

Assistant:

SparseArray<Value>::SparseArray(const SparseArray& src)
    : size_(src.size_),
      sparse_(src.max_size()),
      dense_(src.max_size()) {
  std::copy_n(src.sparse_.data(), src.max_size(), sparse_.data());
  std::copy_n(src.dense_.data(), src.max_size(), dense_.data());
}